

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_RestoreCallbacks(GLFWwindow *window)

{
  ImGui_ImplGlfw_Data *pIVar1;
  
  pIVar1 = ImGui_ImplGlfw_GetBackendData();
  glfwSetWindowFocusCallback(window,pIVar1->PrevUserCallbackWindowFocus);
  glfwSetCursorEnterCallback(window,pIVar1->PrevUserCallbackCursorEnter);
  glfwSetCursorPosCallback(window,pIVar1->PrevUserCallbackCursorPos);
  glfwSetMouseButtonCallback(window,pIVar1->PrevUserCallbackMousebutton);
  glfwSetScrollCallback(window,pIVar1->PrevUserCallbackScroll);
  glfwSetKeyCallback(window,pIVar1->PrevUserCallbackKey);
  glfwSetCharCallback(window,pIVar1->PrevUserCallbackChar);
  glfwSetMonitorCallback(pIVar1->PrevUserCallbackMonitor);
  pIVar1->InstalledCallbacks = false;
  pIVar1->PrevUserCallbackWindowFocus = (GLFWwindowfocusfun)0x0;
  pIVar1->PrevUserCallbackCursorPos = (GLFWcursorposfun)0x0;
  pIVar1->PrevUserCallbackCursorEnter = (GLFWcursorenterfun)0x0;
  pIVar1->PrevUserCallbackMousebutton = (GLFWmousebuttonfun)0x0;
  pIVar1->PrevUserCallbackScroll = (GLFWscrollfun)0x0;
  pIVar1->PrevUserCallbackKey = (GLFWkeyfun)0x0;
  pIVar1->PrevUserCallbackChar = (GLFWcharfun)0x0;
  pIVar1->PrevUserCallbackMonitor = (GLFWmonitorfun)0x0;
  return;
}

Assistant:

void ImGui_ImplGlfw_RestoreCallbacks(GLFWwindow* window)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd->InstalledCallbacks == true && "Callbacks not installed!");
    IM_ASSERT(bd->Window == window);

    glfwSetWindowFocusCallback(window, bd->PrevUserCallbackWindowFocus);
    glfwSetCursorEnterCallback(window, bd->PrevUserCallbackCursorEnter);
    glfwSetCursorPosCallback(window, bd->PrevUserCallbackCursorPos);
    glfwSetMouseButtonCallback(window, bd->PrevUserCallbackMousebutton);
    glfwSetScrollCallback(window, bd->PrevUserCallbackScroll);
    glfwSetKeyCallback(window, bd->PrevUserCallbackKey);
    glfwSetCharCallback(window, bd->PrevUserCallbackChar);
    glfwSetMonitorCallback(bd->PrevUserCallbackMonitor);
    bd->InstalledCallbacks = false;
    bd->PrevUserCallbackWindowFocus = nullptr;
    bd->PrevUserCallbackCursorEnter = nullptr;
    bd->PrevUserCallbackCursorPos = nullptr;
    bd->PrevUserCallbackMousebutton = nullptr;
    bd->PrevUserCallbackScroll = nullptr;
    bd->PrevUserCallbackKey = nullptr;
    bd->PrevUserCallbackChar = nullptr;
    bd->PrevUserCallbackMonitor = nullptr;
}